

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

StringRef __thiscall llbuild::buildsystem::BuildKey::getDirectoryTreeSignaturePath(BuildKey *this)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  uint32_t nameSize;
  BuildKey *this_local;
  ulong local_28;
  
  bVar2 = isDirectoryTreeSignature(this);
  if (!bVar2) {
    __assert_fail("isDirectoryTreeSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                  ,0xfa,
                  "StringRef llbuild::buildsystem::BuildKey::getDirectoryTreeSignaturePath() const")
    ;
  }
  pcVar3 = core::KeyType::data(&this->key);
  uVar1 = *(uint *)(pcVar3 + 1);
  pcVar3 = core::KeyType::data(&this->key);
  this_local = (BuildKey *)(pcVar3 + 5);
  local_28 = (ulong)uVar1;
  return _this_local;
}

Assistant:

StringRef getDirectoryTreeSignaturePath() const {
    assert(isDirectoryTreeSignature());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    return StringRef(&key.data()[1 + sizeof(uint32_t)], nameSize);
  }